

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O2

bool __thiscall curlpp::Multi::perform(Multi *this,int *nbHandles)

{
  int iVar1;
  RuntimeError *this_00;
  char *reason;
  
  iVar1 = curl_multi_perform(this->mMultiHandle);
  if (0xfffffffd < iVar1 - 1U) {
    return iVar1 != -1;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x10);
  reason = (char *)curl_multi_strerror(iVar1);
  RuntimeError::RuntimeError(this_00,reason);
  __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

bool
curlpp::Multi::perform(int * nbHandles)
{
  CURLMcode code = curl_multi_perform(mMultiHandle, nbHandles);
  if(code == CURLM_CALL_MULTI_PERFORM) {
    return false;
  }

  if(code != CURLM_OK) {
    throw curlpp::RuntimeError(curl_multi_strerror(code));
  }

  return true;
}